

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O3

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  int *pDelays;
  uint uVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Lpk_Res_t *pLVar9;
  byte bVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar21;
  undefined1 auVar20 [16];
  
  Lpk_MuxAnalize::Res.nSuppSizeS = 0;
  Lpk_MuxAnalize::Res.nSuppSizeL = 0;
  Lpk_MuxAnalize::Res.DelayEst = 0;
  Lpk_MuxAnalize::Res.AreaEst = 0;
  Lpk_MuxAnalize::Res.nBSVars = 0;
  Lpk_MuxAnalize::Res.BSVars = 0;
  Lpk_MuxAnalize::Res.nCofVars = 0;
  Lpk_MuxAnalize::Res.pCofVars[0] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[1] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[2] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[3] = '\0';
  Lpk_MuxAnalize::Res.Variable = 0;
  Lpk_MuxAnalize::Res.Polarity = 0;
  if ((-1 << ((byte)(*(uint *)&p->field_0x8 >> 7) & 0x1f) ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x33,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                  ,0x34,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
  }
  Lpk_MuxAnalize::Res.Variable = -1;
  Lpk_MuxAnalize::Res.Polarity = 0;
  pDelays = p->pDelays;
  lVar16 = 0;
  do {
    uVar14 = 1 << ((byte)lVar16 & 0x1f);
    if ((p->uSupp >> ((uint)lVar16 & 0x1f) & 1) != 0) {
      uVar1 = p->puSupps[lVar16 * 2];
      uVar3 = (p->puSupps + lVar16 * 2)[1];
      uVar19 = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555);
      uVar21 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
      uVar21 = (uVar21 >> 2 & 0x33333333) + (uVar21 & 0x33333333);
      uVar19 = (uVar19 >> 2 & 0x33333333) + (uVar19 & 0x33333333);
      uVar21 = (uVar21 >> 4 & 0x7070707) + (uVar21 & 0x7070707);
      uVar19 = (uVar19 >> 4 & 0x7070707) + (uVar19 & 0x7070707);
      uVar21 = (uVar21 >> 8 & 0xf000f) + (uVar21 & 0xf000f);
      uVar19 = (uVar19 >> 8 & 0xf000f) + (uVar19 & 0xf000f);
      uVar17 = (uVar21 >> 0x10) + (uVar21 & 0x1f);
      uVar19 = (uVar19 >> 0x10) + (uVar19 & 0x1f);
      uVar21 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
      if (uVar21 <= uVar19) {
        __assert_fail("nSuppSize0 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3b,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      if (uVar21 <= uVar17) {
        __assert_fail("nSuppSize1 < (int)p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcMux.c"
                      ,0x3c,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
      }
      auVar20._0_4_ = -(uint)(uVar17 == 0);
      auVar20._4_4_ = -(uint)(uVar17 == 0);
      auVar20._8_4_ = -(uint)(uVar19 == 0);
      auVar20._12_4_ = -(uint)(uVar19 == 0);
      iVar5 = movmskpd(uVar21,auVar20);
      if (iVar5 == 0) {
        uVar15 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
        iVar5 = uVar15 - 2;
        auVar18._0_4_ = -(uint)(iVar5 < (int)uVar17);
        auVar18._4_4_ = -(uint)(iVar5 < (int)uVar17);
        auVar18._8_4_ = -(uint)(iVar5 < (int)uVar19);
        auVar18._12_4_ = -(uint)(iVar5 < (int)uVar19);
        uVar21 = movmskpd(iVar5,auVar18);
        bVar10 = (byte)uVar21;
        if (((bVar10 >> 1 | bVar10) & 1) == 0) {
          iVar6 = Lpk_SuppDelay(uVar1 | uVar14,pDelays);
          iVar8 = Lpk_SuppDelay(p->puSupps[lVar16 * 2 + 1],pDelays);
          iVar5 = iVar8 + 1;
          if (iVar8 + 1 < iVar6) {
            iVar5 = iVar6;
          }
          iVar8 = Lpk_SuppDelay(uVar14 | p->puSupps[lVar16 * 2 + 1],pDelays);
          iVar7 = Lpk_SuppDelay(p->puSupps[lVar16 * 2],pDelays);
          iVar6 = iVar7 + 1;
          if (iVar7 + 1 < iVar8) {
            iVar6 = iVar8;
          }
          iVar8 = iVar6;
          if (iVar5 < iVar6) {
            iVar8 = iVar5;
          }
          bVar4 = iVar6 <= iVar5;
          iVar5 = 2;
        }
        else {
          cVar12 = (char)uVar17;
          if (bVar10 >> 1 == 0) {
            iVar5 = Lpk_SuppDelay(uVar1 | uVar14,pDelays);
            iVar6 = Lpk_SuppDelay(p->puSupps[lVar16 * 2 + 1],pDelays);
            iVar8 = iVar6 + 1;
            if (iVar6 + 1 < iVar5) {
              iVar8 = iVar5;
            }
            cVar11 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
            iVar5 = ((int)((char)(cVar12 + -1) / cVar11) -
                    (uint)((char)(cVar12 + -1) % cVar11 == '\0')) + 2;
            bVar4 = false;
          }
          else {
            cVar11 = (char)uVar19;
            if ((uVar21 & 1) == 0) {
              iVar5 = Lpk_SuppDelay(uVar3 | uVar14,pDelays);
              iVar6 = Lpk_SuppDelay(p->puSupps[lVar16 * 2],pDelays);
              iVar8 = iVar6 + 1;
              if (iVar6 + 1 < iVar5) {
                iVar8 = iVar5;
              }
              cVar12 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
              iVar5 = ((int)((char)(cVar11 + -1) / cVar12) -
                      (uint)((char)(cVar11 + -1) % cVar12 == '\0')) + 2;
              bVar4 = true;
            }
            else if (uVar15 < uVar19) {
              iVar5 = Lpk_SuppDelay(uVar1 | uVar14,pDelays);
              iVar6 = Lpk_SuppDelay(p->puSupps[lVar16 * 2 + 1],pDelays);
              iVar8 = iVar6 + 1;
              if (iVar6 + 1 < iVar5) {
                iVar8 = iVar5;
              }
              if (uVar15 < uVar17) {
                iVar5 = Lpk_SuppDelay(uVar14 | p->puSupps[lVar16 * 2 + 1],pDelays);
                iVar7 = Lpk_SuppDelay(p->puSupps[lVar16 * 2],pDelays);
                iVar6 = iVar7 + 1;
                if (iVar7 + 1 < iVar5) {
                  iVar6 = iVar5;
                }
                cVar13 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
                iVar7 = iVar6;
                if (iVar8 < iVar6) {
                  iVar7 = iVar8;
                }
                cVar2 = cVar12;
                if (iVar6 < iVar8) {
                  cVar2 = cVar11;
                  cVar11 = cVar12;
                }
                iVar5 = (((int)((char)(cVar11 + '\x01') / cVar13) -
                         (uint)((char)(cVar11 + '\x01') % cVar13 == '\0')) +
                         (int)((char)(cVar2 + -1) / cVar13) + 2) -
                        (uint)((char)(cVar2 + -1) % cVar13 == '\0');
                bVar4 = iVar6 <= iVar8;
                iVar8 = iVar7;
              }
              else {
                cVar12 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
                iVar5 = ((int)((char)(cVar11 + '\x01') / cVar12) -
                        (uint)((char)(cVar11 + '\x01') % cVar12 == '\0')) + 2;
                bVar4 = false;
              }
            }
            else {
              iVar5 = Lpk_SuppDelay(uVar3 | uVar14,pDelays);
              iVar6 = Lpk_SuppDelay(p->puSupps[lVar16 * 2],pDelays);
              iVar8 = iVar6 + 1;
              if (iVar6 + 1 < iVar5) {
                iVar8 = iVar5;
              }
              cVar11 = ((byte)(*(uint *)&p->field_0x8 >> 0xc) & 0xf) - 1;
              iVar5 = ((int)((char)(cVar12 + '\x01') / cVar11) -
                      (uint)((char)(cVar12 + '\x01') % cVar11 == '\0')) + 2;
              bVar4 = true;
            }
          }
        }
        if ((iVar8 <= (int)p->nDelayLim) &&
           (iVar5 <= (int)(*(uint *)&p->field_0x8 >> 0x10 & 0x3fff))) {
          uVar19 = uVar19 + (uint)(bVar4 ^ 1) * 2;
          uVar17 = uVar17 + (uint)bVar4 * 2;
          uVar14 = uVar17;
          if (uVar19 < uVar17) {
            uVar14 = uVar19;
          }
          uVar1 = uVar17;
          if (uVar17 < uVar19) {
            uVar1 = uVar19;
          }
          if (uVar1 <= (*(uint *)&p->field_0x8 >> 7 & 0x1f)) {
            if (Lpk_MuxAnalize::Res.Variable != -1) {
              if (Lpk_MuxAnalize::Res.AreaEst <= iVar5) {
                if (Lpk_MuxAnalize::Res.AreaEst == iVar5) {
                  if (((int)(uVar19 + uVar17) <
                       Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS) ||
                     ((Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS ==
                       uVar19 + uVar17 && (iVar8 < Lpk_MuxAnalize::Res.DelayEst))))
                  goto LAB_004e27c7;
                }
                goto LAB_004e27ec;
              }
            }
LAB_004e27c7:
            Lpk_MuxAnalize::Res.Polarity._0_1_ = bVar4;
            Lpk_MuxAnalize::Res.Variable = (uint)lVar16;
            Lpk_MuxAnalize::Res.Polarity._1_3_ = 0;
            Lpk_MuxAnalize::Res.DelayEst = iVar8;
            Lpk_MuxAnalize::Res.AreaEst = iVar5;
            Lpk_MuxAnalize::Res.nSuppSizeL = uVar1;
            Lpk_MuxAnalize::Res.nSuppSizeS = uVar14;
          }
        }
      }
    }
LAB_004e27ec:
    lVar16 = lVar16 + 1;
    if (lVar16 == 0x10) {
      pLVar9 = (Lpk_Res_t *)0x0;
      if (Lpk_MuxAnalize::Res.Variable != -1) {
        pLVar9 = &Lpk_MuxAnalize::Res;
      }
      return pLVar9;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}